

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_insert(upb_strtable *t,char *k,size_t len,upb_value v,upb_Arena *a)

{
  _Bool _Var1;
  uint uVar2;
  uint32_t hash;
  upb_key tabkey;
  ulong size;
  lookupkey_t key;
  
  uVar2 = (t->t).mask;
  if ((uVar2 - (uVar2 + 1 >> 3)) + 1 == (t->t).count) {
    uVar2 = uVar2 - (uVar2 >> 1 & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    _Var1 = upb_strtable_resize(t,(ulong)((((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18) +
                                         1),a);
    if (len >> 0x20 != 0) {
      return false;
    }
    if (!_Var1) {
      return false;
    }
  }
  else if (len >> 0x20 != 0) {
    return false;
  }
  size = len + 0xc & 0x1fffffff8;
  tabkey = (upb_key)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)tabkey) < size) {
    tabkey.str = (upb_SizePrefixString *)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
  }
  else {
    if ((tabkey.num + 7 & 0xfffffffffffffff8) != tabkey.num) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)&(tabkey.str)->size + size);
  }
  if (tabkey.num == 0) {
    return false;
  }
  (tabkey.str)->size = (uint32_t)len;
  if (len != 0) {
    memcpy((void *)(tabkey.num + 4),k,len);
  }
  *(undefined1 *)(tabkey.num + 4 + len) = 0;
  hash = _upb_Hash(k,len,0x479aa8);
  key.str.size = len;
  key.str.data = k;
  insert(&t->t,key,tabkey,v,hash,strhash,streql);
  return true;
}

Assistant:

bool upb_strtable_insert(upb_strtable* t, const char* k, size_t len,
                         upb_value v, upb_Arena* a) {
  if (isfull(&t->t)) {
    /* Need to resize.  New table of double the size, add old elements to it. */
    if (!upb_strtable_resize(t, _upb_log2_table_size(&t->t) + 1, a)) {
      return false;
    }
  }

  upb_StringView sv = upb_StringView_FromDataAndSize(k, len);
  upb_SizePrefixString* size_prefix_string = upb_SizePrefixString_Copy(sv, a);
  if (!size_prefix_string) return false;

  lookupkey_t lookupkey = {.str = sv};
  upb_key key = {.str = size_prefix_string};
  uint32_t hash = _upb_Hash_NoSeed(k, len);
  insert(&t->t, lookupkey, key, v, hash, &strhash, &streql);
  return true;
}